

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O1

Vec_Str_t * Gia_ManToBridgeVec(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int iVar4;
  Vec_Str_t *vStr;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  
  iVar4 = p->nRegs;
  if (p->vCos->nSize <= iVar4) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x4a,"Vec_Str_t *Gia_ManToBridgeVec(Gia_Man_t *)");
  }
  pGVar2 = p->pObjs;
  pGVar2->Value = 3;
  iVar11 = p->vCis->nSize;
  iVar8 = 2;
  if (0 < (long)iVar11) {
    piVar3 = p->vCis->pArray;
    uVar12 = 4;
    lVar9 = 0;
    do {
      iVar1 = piVar3[lVar9];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001cb4ca;
      if (pGVar2 == (Gia_Obj_t *)0x0) goto LAB_001cb21f;
      pGVar2[iVar1].Value = uVar12;
      lVar9 = lVar9 + 1;
      uVar12 = uVar12 + 2;
    } while (iVar11 != lVar9);
    iVar8 = (int)lVar9 + 2;
  }
LAB_001cb21f:
  iVar1 = p->nObjs;
  if (pGVar2 != (Gia_Obj_t *)0x0 && 0 < (long)iVar1) {
    lVar9 = 0;
    do {
      if ((~*(uint *)(&pGVar2->field_0x0 + lVar9) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(&pGVar2->field_0x0 + lVar9)) {
        if (iVar8 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        *(int *)((long)&pGVar2->Value + lVar9) = iVar8 * 2;
        iVar8 = iVar8 + 1;
      }
      lVar9 = lVar9 + 0xc;
    } while ((long)iVar1 * 0xc != lVar9);
  }
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar5 = (char *)malloc(1000);
  vStr->pArray = pcVar5;
  Gia_AigerWriteUnsigned(vStr,iVar11 - iVar4);
  Gia_AigerWriteUnsigned(vStr,p->nRegs);
  Gia_AigerWriteUnsigned(vStr,~(p->vCos->nSize + p->vCis->nSize) + p->nObjs);
  if (0 < p->nObjs) {
    lVar13 = 8;
    lVar9 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar7 = *(ulong *)((long)pGVar2 + lVar13 + -8);
      if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
        uVar12 = *(uint *)((long)pGVar2 +
                          lVar13 + (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar10 = *(uint *)((long)pGVar2 +
                              lVar13 + (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar10 < 0)) goto LAB_001cb4e9;
        uVar12 = uVar12 ^ (uint)(uVar7 >> 0x1d) & 1;
        uVar10 = uVar10 ^ (uint)(uVar7 >> 0x3d) & 1;
        if (uVar12 == uVar10) {
          __assert_fail("uLit0 != uLit1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                        ,0x60,"Vec_Str_t *Gia_ManToBridgeVec(Gia_Man_t *)");
        }
        Gia_AigerWriteUnsigned(vStr,uVar12 * 2);
        Gia_AigerWriteUnsigned(vStr,uVar10);
      }
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar9 < p->nObjs);
  }
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar11 = 0;
    do {
      iVar8 = p->vCos->nSize;
      uVar12 = (iVar8 - iVar4) + iVar11;
      if (((int)uVar12 < 0) || (iVar8 <= (int)uVar12)) goto LAB_001cb508;
      iVar8 = p->vCos->pArray[uVar12];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_001cb4ca;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar8;
      uVar10 = (uint)*(undefined8 *)pGVar2;
      uVar12 = pGVar2[-(ulong)(uVar10 & 0x1fffffff)].Value;
      if ((int)uVar12 < 0) goto LAB_001cb4e9;
      Gia_AigerWriteUnsigned(vStr,(uVar10 >> 0x1d & 1 ^ uVar12) * 4 + 2);
      iVar11 = iVar11 + 1;
      iVar4 = p->nRegs;
    } while (iVar11 < iVar4);
  }
  Gia_AigerWriteUnsigned(vStr,p->vCos->nSize - iVar4);
  pVVar6 = p->vCos;
  uVar7 = (ulong)(uint)pVVar6->nSize;
  if (p->nRegs < pVVar6->nSize) {
    lVar9 = 0;
    do {
      if ((int)uVar7 <= lVar9) {
LAB_001cb508:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar6->pArray[lVar9];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_001cb4ca:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return vStr;
      }
      pGVar2 = p->pObjs + iVar4;
      uVar10 = (uint)*(undefined8 *)pGVar2;
      uVar12 = pGVar2[-(ulong)(uVar10 & 0x1fffffff)].Value;
      if ((int)uVar12 < 0) {
LAB_001cb4e9:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_AigerWriteUnsigned(vStr,uVar12 ^ uVar10 >> 0x1d & 1 ^ 1);
      lVar9 = lVar9 + 1;
      pVVar6 = p->vCos;
      uVar7 = (ulong)pVVar6->nSize;
    } while (lVar9 < (long)(uVar7 - (long)p->nRegs));
  }
  return vStr;
}

Assistant:

Vec_Str_t * Gia_ManToBridgeVec( Gia_Man_t * p )
{
    Vec_Str_t * vStr;
    Gia_Obj_t * pObj;
    int i, uLit0, uLit1, nNodes;
    assert( Gia_ManPoNum(p) > 0 );

    // start with const1 node (number 1)
    nNodes = 1;
    // assign literals(!!!) to the value field
    Gia_ManConst0(p)->Value = Abc_Var2Lit( nNodes++, 1 );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Abc_Var2Lit( nNodes++, 0 );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Abc_Var2Lit( nNodes++, 0 );

    // write header
    vStr = Vec_StrAlloc( 1000 );
    Gia_AigerWriteUnsigned( vStr, Gia_ManPiNum(p) );
    Gia_AigerWriteUnsigned( vStr, Gia_ManRegNum(p) );
    Gia_AigerWriteUnsigned( vStr, Gia_ManAndNum(p) );

    // write the nodes 
    Gia_ManForEachAnd( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        uLit1 = Gia_ObjFanin1Copy( pObj );
        assert( uLit0 != uLit1 );
        Gia_AigerWriteUnsigned( vStr, uLit0 << 1 );
        Gia_AigerWriteUnsigned( vStr, uLit1 );
    }

    // write latch drivers
    Gia_ManForEachRi( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        Gia_AigerWriteUnsigned( vStr, (uLit0 << 2) | BRIDGE_VALUE_0 );
    }

    // write PO drivers
    Gia_AigerWriteUnsigned( vStr, Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        // complement property output!!!
        Gia_AigerWriteUnsigned( vStr, Abc_LitNot(uLit0) );
    }
    return vStr;
}